

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void fadst8x16_new_avx2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  undefined7 in_register_00000011;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  
  uVar16 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar24 = (long)(int)uVar16 * 0x100;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x1a0);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x220);
  uVar5 = uVar2 << 0x10 | uVar1 & 0xffff;
  iVar6 = (uVar2 & 0xffff) + uVar1 * -0x10000;
  uVar26 = -uVar2 & 0xffff | uVar1 * 0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x180);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x240);
  uVar7 = uVar2 << 0x10 | uVar1 & 0xffff;
  uVar3 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x200);
  uVar18 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x1c0);
  uVar8 = uVar18 << 0x10 | uVar3 & 0xffff;
  iVar9 = (uVar2 & 0xffff) + uVar1 * -0x10000;
  uVar19 = -uVar2 & 0xffff | uVar1 * 0x10000;
  iVar4 = (uVar18 & 0xffff) + uVar3 * -0x10000;
  uVar30 = -uVar18 & 0xffff | uVar3 * 0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x168);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 600);
  uVar21 = uVar2 << 0x10 | uVar1 & 0xffff;
  iVar10 = (uVar2 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x188);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x238);
  uVar29 = uVar2 << 0x10 | uVar1 & 0xffff;
  iVar11 = (uVar2 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x1a8);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x218);
  uVar22 = uVar2 << 0x10 | uVar1 & 0xffff;
  iVar12 = (uVar2 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x1c8);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x1f8);
  uVar20 = uVar2 << 0x10 | uVar1 & 0xffff;
  iVar13 = (uVar2 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x1e8);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x1d8);
  uVar27 = uVar2 << 0x10 | uVar1 & 0xffff;
  iVar14 = (uVar2 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x208);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x1b8);
  uVar28 = uVar2 << 0x10 | uVar1 & 0xffff;
  iVar15 = (uVar2 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x228);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x198);
  uVar23 = uVar2 << 0x10 | uVar1 & 0xffff;
  iVar17 = (uVar2 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x1e0);
  uVar2 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x178);
  uVar3 = *(uint *)((long)vert_filter_length_chroma + lVar24 + 0x248);
  uVar18 = uVar2 << 0x10 | uVar3 & 0xffff;
  iVar25 = (uVar2 & 0xffff) + uVar3 * -0x10000;
  auVar31._4_4_ = uVar5;
  auVar31._0_4_ = uVar5;
  auVar31._8_4_ = uVar5;
  auVar31._12_4_ = uVar5;
  auVar85._4_4_ = uVar26;
  auVar85._0_4_ = uVar26;
  auVar85._8_4_ = uVar26;
  auVar85._12_4_ = uVar26;
  auVar86._0_16_ = ZEXT116(0) * auVar85 + ZEXT116(1) * auVar31;
  auVar86._16_16_ = ZEXT116(1) * auVar85;
  auVar69._4_4_ = iVar6;
  auVar69._0_4_ = iVar6;
  auVar69._8_4_ = iVar6;
  auVar69._12_4_ = iVar6;
  auVar35._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar69;
  auVar35._16_16_ = ZEXT116(1) * auVar31;
  auVar36._4_4_ = uVar7;
  auVar36._0_4_ = uVar7;
  auVar36._8_4_ = uVar7;
  auVar36._12_4_ = uVar7;
  auVar36._20_4_ = uVar8;
  auVar36._16_4_ = uVar8;
  auVar36._24_4_ = uVar8;
  auVar36._28_4_ = uVar8;
  auVar78._4_4_ = iVar9;
  auVar78._0_4_ = iVar9;
  auVar78._8_4_ = iVar9;
  auVar78._12_4_ = iVar9;
  auVar78._20_4_ = iVar4;
  auVar78._16_4_ = iVar4;
  auVar78._24_4_ = iVar4;
  auVar78._28_4_ = iVar4;
  auVar59._4_4_ = uVar19;
  auVar59._0_4_ = uVar19;
  auVar59._8_4_ = uVar19;
  auVar59._12_4_ = uVar19;
  auVar80._4_4_ = uVar30;
  auVar80._0_4_ = uVar30;
  auVar80._8_4_ = uVar30;
  auVar80._12_4_ = uVar30;
  auVar60._0_16_ = ZEXT116(0) * auVar80 + ZEXT116(1) * auVar59;
  auVar60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar80;
  auVar63._4_4_ = uVar21;
  auVar63._0_4_ = uVar21;
  auVar63._8_4_ = uVar21;
  auVar63._12_4_ = uVar21;
  auVar56._4_4_ = uVar29;
  auVar56._0_4_ = uVar29;
  auVar56._8_4_ = uVar29;
  auVar56._12_4_ = uVar29;
  auVar57._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar63;
  auVar57._16_16_ = ZEXT116(1) * auVar56;
  auVar64._4_4_ = iVar10;
  auVar64._0_4_ = iVar10;
  auVar64._8_4_ = iVar10;
  auVar64._12_4_ = iVar10;
  auVar44._4_4_ = iVar11;
  auVar44._0_4_ = iVar11;
  auVar44._8_4_ = iVar11;
  auVar44._12_4_ = iVar11;
  auVar47._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar64;
  auVar47._16_16_ = ZEXT116(1) * auVar44;
  auVar65._4_4_ = uVar22;
  auVar65._0_4_ = uVar22;
  auVar65._8_4_ = uVar22;
  auVar65._12_4_ = uVar22;
  auVar51._4_4_ = uVar20;
  auVar51._0_4_ = uVar20;
  auVar51._8_4_ = uVar20;
  auVar51._12_4_ = uVar20;
  auVar52._0_16_ = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar65;
  auVar52._16_16_ = ZEXT116(1) * auVar51;
  auVar66._4_4_ = iVar12;
  auVar66._0_4_ = iVar12;
  auVar66._8_4_ = iVar12;
  auVar66._12_4_ = iVar12;
  auVar66._20_4_ = iVar13;
  auVar66._16_4_ = iVar13;
  auVar66._24_4_ = iVar13;
  auVar66._28_4_ = iVar13;
  auVar32._4_4_ = uVar27;
  auVar32._0_4_ = uVar27;
  auVar32._8_4_ = uVar27;
  auVar32._12_4_ = uVar27;
  auVar70._4_4_ = uVar28;
  auVar70._0_4_ = uVar28;
  auVar70._8_4_ = uVar28;
  auVar70._12_4_ = uVar28;
  auVar37._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar32;
  auVar37._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar70;
  auVar38._4_4_ = iVar14;
  auVar38._0_4_ = iVar14;
  auVar38._8_4_ = iVar14;
  auVar38._12_4_ = iVar14;
  auVar38._20_4_ = iVar15;
  auVar38._16_4_ = iVar15;
  auVar38._24_4_ = iVar15;
  auVar38._28_4_ = iVar15;
  auVar33._4_4_ = uVar23;
  auVar33._0_4_ = uVar23;
  auVar33._8_4_ = uVar23;
  auVar33._12_4_ = uVar23;
  auVar45._4_4_ = uVar18;
  auVar45._0_4_ = uVar18;
  auVar45._8_4_ = uVar18;
  auVar45._12_4_ = uVar18;
  auVar39._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar33;
  auVar39._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
  auVar34._4_4_ = iVar17;
  auVar34._0_4_ = iVar17;
  auVar34._8_4_ = iVar17;
  auVar34._12_4_ = iVar17;
  auVar46._4_4_ = iVar25;
  auVar46._0_4_ = iVar25;
  auVar46._8_4_ = iVar25;
  auVar46._12_4_ = iVar25;
  auVar61._0_16_ = ZEXT116(0) * (undefined1  [16])input[9] + ZEXT116(1) * (undefined1  [16])input[1]
  ;
  auVar61._16_16_ = ZEXT116(1) * (undefined1  [16])input[9];
  auVar58._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xb] + ZEXT116(1) * (undefined1  [16])input[3];
  auVar58._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[0xb];
  auVar40._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar34;
  auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar46;
  auVar41._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xd] + ZEXT116(1) * (undefined1  [16])input[5];
  auVar41._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[0xd];
  auVar48._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xf] + ZEXT116(1) * (undefined1  [16])input[7];
  auVar48._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[0xf];
  auVar42 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar49 = vpsubsw_avx2(auVar42,auVar48);
  auVar43 = vpsubsw_avx2(auVar42,auVar58);
  auVar61 = vpsubsw_avx2(auVar42,auVar61);
  auVar53 = vpsubsw_avx2(auVar42,auVar41);
  auVar71._0_16_ = ZEXT116(0) * (undefined1  [16])input[4] + ZEXT116(1) * (undefined1  [16])*input;
  auVar71._16_16_ = ZEXT116(1) * (undefined1  [16])input[4];
  auVar87._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xc] + ZEXT116(1) * (undefined1  [16])input[8];
  auVar87._16_16_ = ZEXT116(1) * (undefined1  [16])input[0xc];
  auVar41 = vpblendd_avx2(auVar49,auVar71,0xf0);
  auVar42 = vpblendd_avx2(auVar87,auVar43,0xf0);
  auVar54 = vpunpcklwd_avx2(auVar41,auVar42);
  auVar48 = vpunpckhwd_avx2(auVar41,auVar42);
  iVar4 = 1 << (cos_bit - 1U & 0x1f);
  auVar62._4_4_ = iVar4;
  auVar62._0_4_ = iVar4;
  auVar62._8_4_ = iVar4;
  auVar62._12_4_ = iVar4;
  auVar62._16_4_ = iVar4;
  auVar62._20_4_ = iVar4;
  auVar62._24_4_ = iVar4;
  auVar62._28_4_ = iVar4;
  iVar4 = (uVar1 & 0xffff) + uVar1 * 0x10000;
  auVar74._4_4_ = iVar4;
  auVar74._0_4_ = iVar4;
  auVar74._8_4_ = iVar4;
  auVar74._12_4_ = iVar4;
  auVar74._16_4_ = iVar4;
  auVar74._20_4_ = iVar4;
  auVar74._24_4_ = iVar4;
  auVar74._28_4_ = iVar4;
  auVar41 = vpmaddwd_avx2(auVar54,auVar74);
  auVar41 = vpaddd_avx2(auVar41,auVar62);
  auVar42 = vpsrad_avx2(auVar41,ZEXT416(uVar16));
  auVar41 = vpmaddwd_avx2(auVar48,auVar74);
  auVar41 = vpaddd_avx2(auVar41,auVar62);
  auVar41 = vpsrad_avx2(auVar41,ZEXT416(uVar16));
  auVar41 = vpackssdw_avx2(auVar42,auVar41);
  iVar4 = (uVar1 & 0xffff) + uVar1 * -0x10000;
  auVar81._4_4_ = iVar4;
  auVar81._0_4_ = iVar4;
  auVar81._8_4_ = iVar4;
  auVar81._12_4_ = iVar4;
  auVar81._16_4_ = iVar4;
  auVar81._20_4_ = iVar4;
  auVar81._24_4_ = iVar4;
  auVar81._28_4_ = iVar4;
  auVar42 = vpmaddwd_avx2(auVar54,auVar81);
  auVar48 = vpmaddwd_avx2(auVar81,auVar48);
  auVar42 = vpaddd_avx2(auVar42,auVar62);
  auVar31 = ZEXT416(uVar16);
  auVar54 = vpsrad_avx2(auVar42,auVar31);
  auVar42 = vpaddd_avx2(auVar48,auVar62);
  auVar42 = vpsrad_avx2(auVar42,auVar31);
  auVar42 = vpackssdw_avx2(auVar54,auVar42);
  auVar88._0_16_ = ZEXT116(0) * (undefined1  [16])input[6] + ZEXT116(1) * (undefined1  [16])input[2]
  ;
  auVar88._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[6];
  auVar83._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xe] + ZEXT116(1) * (undefined1  [16])input[10];
  auVar83._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[0xe];
  auVar48 = vperm2i128_avx2(auVar88,auVar53,0x21);
  auVar54 = vperm2i128_avx2(auVar61,auVar83,0x21);
  auVar58 = vpunpcklwd_avx2(auVar48,auVar54);
  auVar50 = vpunpckhwd_avx2(auVar48,auVar54);
  auVar48 = vpmaddwd_avx2(auVar58,auVar74);
  auVar54 = vpmaddwd_avx2(auVar50,auVar74);
  auVar58 = vpmaddwd_avx2(auVar81,auVar58);
  auVar50 = vpmaddwd_avx2(auVar81,auVar50);
  auVar48 = vpaddd_avx2(auVar48,auVar62);
  auVar54 = vpaddd_avx2(auVar54,auVar62);
  auVar48 = vpsrad_avx2(auVar48,auVar31);
  auVar54 = vpsrad_avx2(auVar54,auVar31);
  auVar48 = vpackssdw_avx2(auVar48,auVar54);
  auVar54 = vpaddd_avx2(auVar58,auVar62);
  auVar31 = ZEXT416(uVar16);
  auVar58 = vpsrad_avx2(auVar54,auVar31);
  auVar54 = vpaddd_avx2(auVar50,auVar62);
  auVar54 = vpsrad_avx2(auVar54,auVar31);
  auVar54 = vpackssdw_avx2(auVar58,auVar54);
  auVar50 = vpblendd_avx2(auVar71,auVar49,0xf0);
  auVar72._0_16_ = ZEXT116(0) * auVar42._0_16_ + ZEXT116(1) * auVar41._0_16_;
  auVar72._16_16_ = ZEXT116(0) * auVar41._16_16_ + ZEXT116(1) * auVar42._0_16_;
  auVar58 = vpaddsw_avx2(auVar50,auVar72);
  auVar71 = vpsubsw_avx2(auVar50,auVar72);
  auVar50 = vpblendd_avx2(auVar87,auVar43,0xf);
  auVar42 = vperm2i128_avx2(auVar41,auVar42,0x31);
  auVar41 = vpaddsw_avx2(auVar50,auVar42);
  auVar42 = vpsubsw_avx2(auVar50,auVar42);
  auVar49 = vpblendd_avx2(auVar61,auVar83,0xf0);
  auVar76._0_16_ = ZEXT116(0) * auVar54._0_16_ + ZEXT116(1) * auVar48._0_16_;
  auVar76._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar54._0_16_;
  auVar50 = vpaddsw_avx2(auVar76,auVar49);
  auVar61 = vpsubsw_avx2(auVar49,auVar76);
  auVar43 = vpblendd_avx2(auVar88,auVar53,0xf0);
  auVar48 = vperm2i128_avx2(auVar48,auVar54,0x31);
  auVar49 = vpaddsw_avx2(auVar43,auVar48);
  auVar43 = vpsubsw_avx2(auVar43,auVar48);
  auVar77._0_16_ = ZEXT116(0) * auVar42._0_16_ + ZEXT116(1) * auVar41._0_16_;
  auVar77._16_16_ = ZEXT116(0) * auVar41._16_16_ + ZEXT116(1) * auVar42._0_16_;
  auVar41 = vperm2i128_avx2(auVar41,auVar42,0x31);
  auVar42 = vpunpcklwd_avx2(auVar77,auVar41);
  auVar54 = vpunpckhwd_avx2(auVar77,auVar41);
  auVar41 = vpmaddwd_avx2(auVar86,auVar42);
  auVar48 = vpmaddwd_avx2(auVar35,auVar42);
  auVar42 = vpmaddwd_avx2(auVar86,auVar54);
  auVar54 = vpmaddwd_avx2(auVar35,auVar54);
  auVar41 = vpaddd_avx2(auVar41,auVar62);
  auVar42 = vpaddd_avx2(auVar42,auVar62);
  auVar48 = vpaddd_avx2(auVar48,auVar62);
  auVar54 = vpaddd_avx2(auVar54,auVar62);
  auVar41 = vpsrad_avx2(auVar41,auVar31);
  auVar42 = vpsrad_avx2(auVar42,auVar31);
  auVar48 = vpsrad_avx2(auVar48,auVar31);
  auVar54 = vpsrad_avx2(auVar54,auVar31);
  auVar41 = vpackssdw_avx2(auVar41,auVar42);
  auVar42 = vpackssdw_avx2(auVar48,auVar54);
  auVar73._0_16_ = ZEXT116(0) * auVar43._0_16_ + ZEXT116(1) * auVar49._0_16_;
  auVar73._16_16_ = ZEXT116(0) * auVar49._16_16_ + ZEXT116(1) * auVar43._0_16_;
  auVar48 = vperm2i128_avx2(auVar49,auVar43,0x31);
  auVar49 = vpunpcklwd_avx2(auVar73,auVar48);
  auVar43 = vpunpckhwd_avx2(auVar73,auVar48);
  auVar48 = vpmaddwd_avx2(auVar49,auVar86);
  auVar54 = vpmaddwd_avx2(auVar86,auVar43);
  auVar49 = vpmaddwd_avx2(auVar49,auVar35);
  auVar43 = vpmaddwd_avx2(auVar35,auVar43);
  auVar48 = vpaddd_avx2(auVar48,auVar62);
  auVar54 = vpaddd_avx2(auVar54,auVar62);
  auVar48 = vpsrad_avx2(auVar48,auVar31);
  auVar54 = vpsrad_avx2(auVar54,auVar31);
  auVar48 = vpackssdw_avx2(auVar48,auVar54);
  auVar54 = vpaddd_avx2(auVar49,auVar62);
  auVar31 = ZEXT416(uVar16);
  auVar49 = vpsrad_avx2(auVar54,auVar31);
  auVar54 = vpaddd_avx2(auVar43,auVar62);
  auVar54 = vpsrad_avx2(auVar54,auVar31);
  auVar54 = vpackssdw_avx2(auVar49,auVar54);
  auVar53._0_16_ = ZEXT116(0) * auVar42._0_16_ + ZEXT116(1) * auVar41._0_16_;
  auVar53._16_16_ = ZEXT116(0) * auVar41._16_16_ + ZEXT116(1) * auVar42._0_16_;
  auVar49 = vpaddsw_avx2(auVar58,auVar53);
  auVar53 = vpsubsw_avx2(auVar58,auVar53);
  auVar41 = vperm2i128_avx2(auVar41,auVar42,0x31);
  auVar58 = vpaddsw_avx2(auVar71,auVar41);
  auVar71 = vpsubsw_avx2(auVar71,auVar41);
  auVar42._0_16_ = ZEXT116(0) * auVar54._0_16_ + ZEXT116(1) * auVar48._0_16_;
  auVar42._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar54._0_16_;
  auVar41 = vpaddsw_avx2(auVar50,auVar42);
  auVar50 = vpsubsw_avx2(auVar50,auVar42);
  auVar48 = vperm2i128_avx2(auVar48,auVar54,0x31);
  auVar42 = vpaddsw_avx2(auVar61,auVar48);
  auVar43 = vpsubsw_avx2(auVar61,auVar48);
  auVar67._0_16_ = ZEXT116(0) * auVar42._0_16_ + ZEXT116(1) * auVar41._0_16_;
  auVar67._16_16_ = ZEXT116(0) * auVar41._16_16_ + ZEXT116(1) * auVar42._0_16_;
  auVar41 = vperm2i128_avx2(auVar41,auVar42,0x31);
  auVar48 = vpunpcklwd_avx2(auVar67,auVar41);
  auVar42 = vpunpckhwd_avx2(auVar67,auVar41);
  auVar41 = vpmaddwd_avx2(auVar36,auVar48);
  auVar48 = vpmaddwd_avx2(auVar78,auVar48);
  auVar54 = vpmaddwd_avx2(auVar78,auVar42);
  auVar42 = vpmaddwd_avx2(auVar36,auVar42);
  auVar41 = vpaddd_avx2(auVar41,auVar62);
  auVar42 = vpaddd_avx2(auVar42,auVar62);
  auVar48 = vpaddd_avx2(auVar48,auVar62);
  auVar54 = vpaddd_avx2(auVar54,auVar62);
  auVar41 = vpsrad_avx2(auVar41,auVar31);
  auVar42 = vpsrad_avx2(auVar42,auVar31);
  auVar48 = vpsrad_avx2(auVar48,auVar31);
  auVar54 = vpsrad_avx2(auVar54,auVar31);
  auVar41 = vpackssdw_avx2(auVar41,auVar42);
  auVar42 = vpackssdw_avx2(auVar48,auVar54);
  auVar75._0_16_ = ZEXT116(0) * auVar43._0_16_ + ZEXT116(1) * auVar50._0_16_;
  auVar75._16_16_ = ZEXT116(0) * auVar50._16_16_ + ZEXT116(1) * auVar43._0_16_;
  auVar48 = vperm2i128_avx2(auVar50,auVar43,0x31);
  auVar50 = vpunpcklwd_avx2(auVar75,auVar48);
  auVar43 = vpunpckhwd_avx2(auVar75,auVar48);
  auVar48 = vpmaddwd_avx2(auVar60,auVar50);
  auVar54 = vpmaddwd_avx2(auVar60,auVar43);
  auVar50 = vpmaddwd_avx2(auVar36,auVar50);
  auVar43 = vpmaddwd_avx2(auVar36,auVar43);
  auVar48 = vpaddd_avx2(auVar48,auVar62);
  auVar54 = vpaddd_avx2(auVar54,auVar62);
  auVar48 = vpsrad_avx2(auVar48,auVar31);
  auVar54 = vpsrad_avx2(auVar54,auVar31);
  auVar48 = vpackssdw_avx2(auVar48,auVar54);
  auVar54 = vpaddd_avx2(auVar50,auVar62);
  auVar50 = vpsrad_avx2(auVar54,auVar31);
  auVar54 = vpaddd_avx2(auVar43,auVar62);
  auVar54 = vpsrad_avx2(auVar54,auVar31);
  auVar54 = vpackssdw_avx2(auVar50,auVar54);
  auVar43._0_16_ = ZEXT116(0) * auVar42._0_16_ + ZEXT116(1) * auVar41._0_16_;
  auVar43._16_16_ = ZEXT116(0) * auVar41._16_16_ + ZEXT116(1) * auVar42._0_16_;
  auVar50 = vpaddsw_avx2(auVar49,auVar43);
  auVar43 = vpsubsw_avx2(auVar49,auVar43);
  auVar42 = vperm2i128_avx2(auVar41,auVar42,0x31);
  auVar41 = vpaddsw_avx2(auVar58,auVar42);
  auVar61 = vpsubsw_avx2(auVar58,auVar42);
  auVar68._0_16_ = ZEXT116(0) * auVar54._0_16_ + ZEXT116(1) * auVar48._0_16_;
  auVar68._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar54._0_16_;
  auVar58 = vpaddsw_avx2(auVar53,auVar68);
  auVar53 = vpsubsw_avx2(auVar53,auVar68);
  auVar42 = vperm2i128_avx2(auVar48,auVar54,0x31);
  auVar49 = vpaddsw_avx2(auVar71,auVar42);
  auVar71 = vpsubsw_avx2(auVar71,auVar42);
  auVar54._0_16_ = ZEXT116(0) * auVar41._0_16_ + ZEXT116(1) * auVar50._0_16_;
  auVar54._16_16_ = ZEXT116(0) * auVar50._16_16_ + ZEXT116(1) * auVar41._0_16_;
  auVar41 = vperm2i128_avx2(auVar50,auVar41,0x31);
  auVar48 = vpunpcklwd_avx2(auVar54,auVar41);
  auVar54 = vpunpckhwd_avx2(auVar54,auVar41);
  auVar41 = vpmaddwd_avx2(auVar57,auVar48);
  auVar42 = vpmaddwd_avx2(auVar57,auVar54);
  auVar48 = vpmaddwd_avx2(auVar47,auVar48);
  auVar54 = vpmaddwd_avx2(auVar47,auVar54);
  auVar41 = vpaddd_avx2(auVar41,auVar62);
  auVar42 = vpaddd_avx2(auVar42,auVar62);
  auVar48 = vpaddd_avx2(auVar48,auVar62);
  auVar54 = vpaddd_avx2(auVar54,auVar62);
  auVar41 = vpsrad_avx2(auVar41,auVar31);
  auVar42 = vpsrad_avx2(auVar42,auVar31);
  auVar48 = vpsrad_avx2(auVar48,auVar31);
  auVar54 = vpsrad_avx2(auVar54,auVar31);
  auVar41 = vpackssdw_avx2(auVar41,auVar42);
  auVar42 = vpackssdw_avx2(auVar48,auVar54);
  auVar55._0_16_ = ZEXT116(0) * auVar49._0_16_ + ZEXT116(1) * auVar58._0_16_;
  auVar55._16_16_ = ZEXT116(0) * auVar58._16_16_ + ZEXT116(1) * auVar49._0_16_;
  auVar48 = vperm2i128_avx2(auVar58,auVar49,0x31);
  auVar58 = vpunpcklwd_avx2(auVar55,auVar48);
  auVar50 = vpunpckhwd_avx2(auVar55,auVar48);
  auVar48 = vpmaddwd_avx2(auVar58,auVar52);
  auVar54 = vpmaddwd_avx2(auVar52,auVar50);
  auVar58 = vpmaddwd_avx2(auVar58,auVar66);
  auVar50 = vpmaddwd_avx2(auVar66,auVar50);
  *output = auVar42._0_16_;
  output[0xd] = auVar41._16_16_;
  auVar48 = vpaddd_avx2(auVar48,auVar62);
  auVar54 = vpaddd_avx2(auVar54,auVar62);
  auVar58 = vpaddd_avx2(auVar58,auVar62);
  auVar50 = vpaddd_avx2(auVar50,auVar62);
  auVar48 = vpsrad_avx2(auVar48,auVar31);
  auVar54 = vpsrad_avx2(auVar54,auVar31);
  auVar31 = ZEXT416(uVar16);
  auVar58 = vpsrad_avx2(auVar58,auVar31);
  auVar50 = vpsrad_avx2(auVar50,auVar31);
  auVar48 = vpackssdw_avx2(auVar48,auVar54);
  auVar54 = vpackssdw_avx2(auVar58,auVar50);
  auVar79._0_16_ = ZEXT116(0) * auVar71._0_16_ + ZEXT116(1) * auVar53._0_16_;
  auVar79._16_16_ = ZEXT116(0) * auVar53._16_16_ + ZEXT116(1) * auVar71._0_16_;
  auVar58 = vperm2i128_avx2(auVar53,auVar71,0x31);
  auVar71 = vpunpcklwd_avx2(auVar79,auVar58);
  auVar53 = vpunpckhwd_avx2(auVar79,auVar58);
  auVar58 = vpmaddwd_avx2(auVar40,auVar71);
  auVar50 = vpmaddwd_avx2(auVar53,auVar40);
  auVar58 = vpaddd_avx2(auVar58,auVar62);
  auVar50 = vpaddd_avx2(auVar50,auVar62);
  auVar58 = vpsrad_avx2(auVar58,auVar31);
  auVar50 = vpsrad_avx2(auVar50,auVar31);
  auVar58 = vpackssdw_avx2(auVar58,auVar50);
  auVar82._0_16_ = ZEXT116(0) * auVar58._0_16_ + ZEXT116(1) * auVar48._0_16_;
  auVar82._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar58._0_16_;
  auVar84._0_16_ = ZEXT116(0) * auVar61._0_16_ + ZEXT116(1) * auVar43._0_16_;
  auVar84._16_16_ = ZEXT116(0) * auVar43._16_16_ + ZEXT116(1) * auVar61._0_16_;
  auVar50 = vperm2i128_avx2(auVar43,auVar61,0x31);
  auVar61 = vpunpcklwd_avx2(auVar84,auVar50);
  auVar43 = vpunpckhwd_avx2(auVar84,auVar50);
  auVar50 = vpmaddwd_avx2(auVar38,auVar61);
  auVar49 = vpmaddwd_avx2(auVar38,auVar43);
  auVar50 = vpaddd_avx2(auVar50,auVar62);
  auVar49 = vpaddd_avx2(auVar49,auVar62);
  auVar50 = vpsrad_avx2(auVar50,auVar31);
  auVar49 = vpsrad_avx2(auVar49,auVar31);
  *(undefined1 (*) [32])(output + 0xb) = auVar82;
  auVar50 = vpackssdw_avx2(auVar50,auVar49);
  auVar48 = vperm2i128_avx2(auVar48,auVar50,0x31);
  *(undefined1 (*) [32])(output + 9) = auVar48;
  auVar48 = vpmaddwd_avx2(auVar37,auVar61);
  auVar49 = vpmaddwd_avx2(auVar37,auVar43);
  auVar48 = vpaddd_avx2(auVar48,auVar62);
  auVar49 = vpaddd_avx2(auVar49,auVar62);
  auVar48 = vpsrad_avx2(auVar48,auVar31);
  auVar49 = vpsrad_avx2(auVar49,auVar31);
  auVar48 = vpackssdw_avx2(auVar48,auVar49);
  auVar49._0_16_ = ZEXT116(0) * auVar50._0_16_ + ZEXT116(1) * auVar48._0_16_;
  auVar49._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar50._0_16_;
  *(undefined1 (*) [32])(output + 7) = auVar49;
  auVar50 = vpmaddwd_avx2(auVar39,auVar71);
  auVar49 = vpmaddwd_avx2(auVar53,auVar39);
  auVar50 = vpaddd_avx2(auVar50,auVar62);
  auVar43 = vpsrad_avx2(auVar50,auVar31);
  auVar50 = vpaddd_avx2(auVar49,auVar62);
  auVar50 = vpsrad_avx2(auVar50,auVar31);
  auVar48 = vperm2i128_avx2(auVar48,auVar54,0x31);
  *(undefined1 (*) [32])(output + 5) = auVar48;
  auVar48 = vpackssdw_avx2(auVar43,auVar50);
  auVar50._0_16_ = ZEXT116(0) * auVar54._0_16_ + ZEXT116(1) * auVar48._0_16_;
  auVar50._16_16_ = ZEXT116(0) * auVar48._16_16_ + ZEXT116(1) * auVar54._0_16_;
  *(undefined1 (*) [32])(output + 3) = auVar50;
  auVar42 = vperm2i128_avx2(auVar48,auVar42,0x31);
  *(undefined1 (*) [32])(output + 1) = auVar42;
  auVar41 = vperm2i128_avx2(auVar58,auVar41,0x21);
  *(undefined1 (*) [32])(output + 0xe) = auVar41;
  return;
}

Assistant:

static inline void fadst8x16_new_avx2(const __m128i *input, __m128i *output,
                                      int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __zero = _mm256_setzero_si256();
  const __m256i __rounding_256 = _mm256_set1_epi32(1 << (cos_bit - 1));
  __m256i in0, in1;
  __m128i temp0, temp1, temp2, temp3;

  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  __m128i cospi_m56_p08 = pair_set_epi16(-cospi[56], cospi[8]);
  __m128i cospi_m24_p40 = pair_set_epi16(-cospi[24], cospi[40]);
  __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);

  __m256i cospi_arr[20];

  cospi_arr[0] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p32_p32, 0x1);
  cospi_arr[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_m32),
                                         cospi_p32_m32, 0x1);
  cospi_arr[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p32_p32, 0x1);
  cospi_arr[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_m32),
                                         cospi_p32_m32, 0x1);
  cospi_arr[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p16_p48),
                                         cospi_m48_p16, 0x1);
  cospi_arr[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p48_m16),
                                         cospi_p16_p48, 0x1);
  cospi_arr[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p16_p48),
                                         cospi_m48_p16, 0x1);
  cospi_arr[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p48_m16),
                                         cospi_p16_p48, 0x1);
  cospi_arr[8] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p08_p56),
                                         cospi_p40_p24, 0x1);
  cospi_arr[9] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p56_m08),
                                         cospi_p24_m40, 0x1);
  cospi_arr[10] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m56_p08),
                                          cospi_m24_p40, 0x1);
  cospi_arr[11] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p08_p56),
                                          cospi_p40_p24, 0x1);
  cospi_arr[12] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p02_p62),
                                          cospi_p10_p54, 0x1);
  cospi_arr[13] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p62_m02),
                                          cospi_p54_m10, 0x1);
  cospi_arr[14] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p18_p46),
                                          cospi_p26_p38, 0x1);
  cospi_arr[15] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p46_m18),
                                          cospi_p38_m26, 0x1);
  cospi_arr[16] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p34_p30),
                                          cospi_p42_p22, 0x1);
  cospi_arr[17] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p30_m34),
                                          cospi_p22_m42, 0x1);
  cospi_arr[18] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p50_p14),
                                          cospi_p58_p06, 0x1);
  cospi_arr[19] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p14_m50),
                                          cospi_p06_m58, 0x1);

  __m256i x[8];
  x[0] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[0]), input[4], 0x1);
  x[1] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[2]), input[6], 0x1);
  x[2] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[8]), input[12], 0x1);
  x[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[10]), input[14],
                                 0x1);
  x[4] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[1]), input[9], 0x1);
  x[5] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[3]), input[11], 0x1);
  x[6] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[5]), input[13], 0x1);
  x[7] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[7]), input[15], 0x1);

  // stage 1
  __m256i x1[8];
  x1[0] = x[0];
  x1[1] = _mm256_subs_epi16(__zero, x[7]);
  x1[2] = x[2];
  x1[3] = _mm256_subs_epi16(__zero, x[5]);
  x1[4] = _mm256_subs_epi16(__zero, x[4]);
  x1[5] = x[3];
  x1[6] = _mm256_subs_epi16(__zero, x[6]);
  x1[7] = x[1];

  // stage 2
  __m256i x2[8];
  x2[0] = _mm256_blend_epi32(x1[0], x1[1], 0xf0);
  x2[3] = _mm256_blend_epi32(x1[3], x1[2], 0xf0);
  x2[4] = _mm256_blend_epi32(x1[4], x1[5], 0xf0);
  x2[7] = _mm256_blend_epi32(x1[7], x1[6], 0xf0);
  in0 = _mm256_blend_epi32(x1[1], x1[0], 0xf0);
  in1 = _mm256_blend_epi32(x1[2], x1[3], 0xf0);
  btf_16_avx2(&cospi_arr[0], &cospi_arr[1], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x2[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x2[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);
  in0 = _mm256_permute2f128_si256(x1[7], x1[6], 0x21);
  in1 = _mm256_permute2f128_si256(x1[4], x1[5], 0x21);
  btf_16_avx2(&cospi_arr[2], &cospi_arr[3], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x2[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x2[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);

  // stage 3
  __m256i x3[8];
  x3[0] = _mm256_adds_epi16(x2[0], x2[1]);
  x3[1] = _mm256_subs_epi16(x2[0], x2[1]);
  x3[2] = _mm256_adds_epi16(x2[3], x2[2]);
  x3[3] = _mm256_subs_epi16(x2[3], x2[2]);
  x3[4] = _mm256_adds_epi16(x2[4], x2[5]);
  x3[5] = _mm256_subs_epi16(x2[4], x2[5]);
  x3[6] = _mm256_adds_epi16(x2[7], x2[6]);
  x3[7] = _mm256_subs_epi16(x2[7], x2[6]);

  // stage 4
  __m256i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[4] = x3[4];
  x4[5] = x3[5];
  in0 = _mm256_permute2f128_si256(x3[2], x3[3], 0x20);
  in1 = _mm256_permute2f128_si256(x3[2], x3[3], 0x31);
  btf_16_avx2(&cospi_arr[4], &cospi_arr[5], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x4[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x4[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);
  in0 = _mm256_permute2f128_si256(x3[6], x3[7], 0x20);
  in1 = _mm256_permute2f128_si256(x3[6], x3[7], 0x31);
  btf_16_avx2(&cospi_arr[6], &cospi_arr[7], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x4[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x4[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);

  // stage 5
  __m256i x5[8];
  x5[0] = _mm256_adds_epi16(x4[0], x4[2]);
  x5[1] = _mm256_subs_epi16(x4[0], x4[2]);
  x5[2] = _mm256_adds_epi16(x4[1], x4[3]);
  x5[3] = _mm256_subs_epi16(x4[1], x4[3]);
  x5[4] = _mm256_adds_epi16(x4[4], x4[6]);
  x5[5] = _mm256_subs_epi16(x4[4], x4[6]);
  x5[6] = _mm256_adds_epi16(x4[5], x4[7]);
  x5[7] = _mm256_subs_epi16(x4[5], x4[7]);

  // stage 6
  __m256i x6[8];
  x6[0] = x5[0];
  x6[1] = x5[2];
  x6[2] = x5[1];
  x6[3] = x5[3];
  in0 = _mm256_permute2f128_si256(x5[4], x5[6], 0x20);
  in1 = _mm256_permute2f128_si256(x5[4], x5[6], 0x31);
  btf_16_avx2(&cospi_arr[8], &cospi_arr[9], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);
  x6[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x6[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);
  in0 = _mm256_permute2f128_si256(x5[5], x5[7], 0x20);
  in1 = _mm256_permute2f128_si256(x5[5], x5[7], 0x31);
  btf_16_avx2(&cospi_arr[10], &cospi_arr[11], &in0, &in1, &temp0, &temp1,
              &temp2, &temp3, &__rounding_256, &cos_bit);
  x6[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp1, 0x1);
  x6[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp3, 0x1);

  // stage 7
  __m256i x7[8];
  x7[0] = _mm256_adds_epi16(x6[0], x6[4]);
  x7[1] = _mm256_subs_epi16(x6[0], x6[4]);
  x7[2] = _mm256_adds_epi16(x6[1], x6[5]);
  x7[3] = _mm256_subs_epi16(x6[1], x6[5]);
  x7[4] = _mm256_adds_epi16(x6[2], x6[6]);
  x7[5] = _mm256_subs_epi16(x6[2], x6[6]);
  x7[6] = _mm256_adds_epi16(x6[3], x6[7]);
  x7[7] = _mm256_subs_epi16(x6[3], x6[7]);

  // stage 8
  in0 = _mm256_permute2f128_si256(x7[0], x7[2], 0x20);
  in1 = _mm256_permute2f128_si256(x7[0], x7[2], 0x31);
  btf_16_avx2(&cospi_arr[12], &cospi_arr[13], &in0, &in1, &output[15],
              &output[0], &output[13], &output[2], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x7[4], x7[6], 0x20);
  in1 = _mm256_permute2f128_si256(x7[4], x7[6], 0x31);
  btf_16_avx2(&cospi_arr[14], &cospi_arr[15], &in0, &in1, &output[11],
              &output[4], &output[9], &output[6], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x7[1], x7[3], 0x20);
  in1 = _mm256_permute2f128_si256(x7[1], x7[3], 0x31);
  btf_16_avx2(&cospi_arr[16], &cospi_arr[17], &in0, &in1, &output[7],
              &output[8], &output[5], &output[10], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x7[5], x7[7], 0x20);
  in1 = _mm256_permute2f128_si256(x7[5], x7[7], 0x31);
  btf_16_avx2(&cospi_arr[18], &cospi_arr[19], &in0, &in1, &output[3],
              &output[12], &output[1], &output[14], &__rounding_256, &cos_bit);
}